

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O3

VCONTROLLER * create_keyboard_controller(char *config_path)

{
  VCONTROLLER *this;
  void *pvVar1;
  
  this = (VCONTROLLER *)malloc(0x50);
  pvVar1 = calloc(1,0xc);
  this->private_data = pvVar1;
  this->button[0] = 0;
  this->button[1] = 0;
  this->button[2] = 0;
  this->poll = poll;
  this->calibrate_button = calibrate_button;
  this->get_button_description = get_button_description;
  this->read_config = read_config;
  this->write_config = write_config;
  read_config(this,config_path);
  return this;
}

Assistant:

VCONTROLLER *create_keyboard_controller(const char *config_path)
{
   int i;
   VCONTROLLER *ret = malloc(sizeof(VCONTROLLER));

   ret->private_data = malloc(3 * sizeof(int));
   for (i = 0; i < 3; i++) {
      ret->button[i] = 0;
      ((int *)(ret->private_data))[i] = 0;
   }
   ret->poll = poll;
   ret->calibrate_button = calibrate_button;
   ret->get_button_description = get_button_description;
   ret->read_config = read_config;
   ret->write_config = write_config;

   read_config(ret, config_path);

   return ret;
}